

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O2

void dragon_shield_check(int *shield,int *damage)

{
  int iVar1;
  ostream *poVar2;
  
  *shield = *shield - *damage;
  iVar1 = *shield;
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1345a);
  if (iVar1 < 0) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*damage + *shield);
    poVar2 = std::operator<<(poVar2,anon_var_dwarf_1342e);
    std::endl<char,std::char_traits<char>>(poVar2);
    *damage = -*shield;
    damage = shield;
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*damage);
    poVar2 = std::operator<<(poVar2,anon_var_dwarf_1342e);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  *damage = 0;
  return;
}

Assistant:

void dragon_shield_check(int* shield,int* damage){
	*shield -= *damage;
	if(*shield<0){
		cout<<"(龍盾吸收了 "<<*shield + *damage<<" 點傷害)"<<endl;
		*damage = -*shield;
		*shield=0;
	}
	else {
		cout<<"(龍盾吸收了 "<<*damage<<" 點傷害)"<<endl;
		*damage=0;
	}
}